

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongestEdgeBisection.h
# Opt level: O0

void leb__HeapWriteExplicit(leb_Heap *leb,leb_Node node,int32_t bitCount,uint32_t bitData)

{
  undefined1 local_40 [8];
  leb__HeapArgs args;
  uint32_t bitData_local;
  int32_t bitCount_local;
  leb_Heap *leb_local;
  leb_Node node_local;
  
  args.bitCountMSB = bitData;
  args._28_4_ = bitCount;
  leb__CreateHeapArgs((leb__HeapArgs *)local_40,leb,node,bitCount);
  leb__BitFieldInsert((uint32_t *)local_40,(uint32_t)args.bitFieldMSB,args.bitFieldMSB._4_4_,
                      args.bitCountMSB);
  leb__BitFieldInsert(args.bitFieldLSB,0,args.bitOffsetLSB,
                      args.bitCountMSB >> ((byte)args.bitFieldMSB._4_4_ & 0x1f));
  return;
}

Assistant:

static void
leb__HeapWriteExplicit(
    leb_Heap *leb,
    const leb_Node node,
    int32_t bitCount,
    uint32_t bitData
) {
    leb__HeapArgs args = leb__CreateHeapArgs(leb, node, bitCount);

    leb__BitFieldInsert(args.bitFieldLSB,
                        args.bitOffsetLSB,
                        args.bitCountLSB,
                        bitData);
    leb__BitFieldInsert(args.bitFieldMSB,
                        0u,
                        args.bitCountMSB,
                        bitData >> args.bitCountLSB);
}